

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_wait_test.c
# Opt level: O0

void consumer_mu_n(testing t,mu_queue *q,int start,int count)

{
  nsync_time abs_deadline;
  uint uVar1;
  void *pvVar2;
  char *pcVar3;
  int x;
  void *v;
  int i;
  int count_local;
  int start_local;
  mu_queue *q_local;
  testing t_local;
  
  for (v._4_4_ = 0; v._4_4_ != count; v._4_4_ = v._4_4_ + 1) {
    abs_deadline.tv_nsec = 999999999;
    abs_deadline.tv_sec = 0x7fffffffffffffff;
    pvVar2 = mu_queue_get(q,abs_deadline);
    if (pvVar2 == (void *)0x0) {
      pcVar3 = smprintf("mu_queue_get() returned 0 with no deadline");
      testing_error_(t,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O0/cpp/testing/mu_wait_test.c"
                     ,0x80,pcVar3);
    }
    uVar1 = (int)pvVar2 - 0x1111a1;
    if (uVar1 != (start + v._4_4_) * 3) {
      pcVar3 = smprintf("mu_queue_get() returned bad value; want %d, got %d",
                        (ulong)(uint)((start + v._4_4_) * 3),(ulong)uVar1);
      testing_error_(t,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O0/cpp/testing/mu_wait_test.c"
                     ,0x85,pcVar3);
    }
  }
  return;
}

Assistant:

static void consumer_mu_n (testing t, mu_queue *q, int start, int count) {
	int i;
	for (i = 0; i != count; i++) {
		void *v = mu_queue_get (q, nsync_time_no_deadline);
		int x;
		if (v == NULL) {
			TEST_FATAL (t, ("mu_queue_get() returned 0 with no deadline"));
		}
		x = PTR_TO_INT (v);
		if (x != (start+i)*3) {
			TEST_FATAL (t, ("mu_queue_get() returned bad value; want %d, got %d",
				   (start+i)*3, x));
		}
	}
}